

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_zip_options(archive_write *a,char *key,char *val)

{
  int iVar1;
  archive_string_conv *paVar2;
  archive_conflict *in_RDX;
  char *in_RSI;
  archive *in_RDI;
  int ret;
  zip_conflict *zip;
  char *charset;
  wchar_t local_4;
  
  charset = *(char **)&in_RDI[1].current_codepage;
  local_4 = L'\xffffffe7';
  iVar1 = strcmp(in_RSI,"compression");
  if (iVar1 == 0) {
    if ((in_RDX == (archive_conflict *)0x0) || ((char)in_RDX->magic == '\0')) {
      archive_set_error(in_RDI,-1,"%s: compression option needs a compression name",in_RDI[1].sconv)
      ;
    }
    else {
      iVar1 = strcmp((char *)in_RDX,"deflate");
      if (iVar1 == 0) {
        charset[0xa0] = '\b';
        charset[0xa1] = '\0';
        charset[0xa2] = '\0';
        charset[0xa3] = '\0';
        local_4 = L'\0';
      }
      else {
        iVar1 = strcmp((char *)in_RDX,"store");
        if (iVar1 == 0) {
          charset[0xa0] = '\0';
          charset[0xa1] = '\0';
          charset[0xa2] = '\0';
          charset[0xa3] = '\0';
          local_4 = L'\0';
        }
      }
    }
  }
  else {
    iVar1 = strcmp(in_RSI,"experimental");
    if (iVar1 == 0) {
      if ((in_RDX == (archive_conflict *)0x0) || ((char)in_RDX->magic == '\0')) {
        *(uint *)(charset + 0xa8) = *(uint *)(charset + 0xa8) & 0xfffffffb;
      }
      else {
        *(uint *)(charset + 0xa8) = *(uint *)(charset + 0xa8) | 4;
      }
      local_4 = L'\0';
    }
    else {
      iVar1 = strcmp(in_RSI,"fakecrc32");
      if (iVar1 == 0) {
        if ((in_RDX == (archive_conflict *)0x0) || ((char)in_RDX->magic == '\0')) {
          *(code **)(charset + 0x60) = real_crc32;
        }
        else {
          *(code **)(charset + 0x60) = fake_crc32;
        }
        local_4 = L'\0';
      }
      else {
        iVar1 = strcmp(in_RSI,"hdrcharset");
        if (iVar1 == 0) {
          if ((in_RDX == (archive_conflict *)0x0) || ((char)in_RDX->magic == '\0')) {
            archive_set_error(in_RDI,-1,"%s: hdrcharset option needs a character-set name",
                              in_RDI[1].sconv);
          }
          else {
            paVar2 = archive_string_conversion_to_charset(in_RDX,charset,local_4);
            *(archive_string_conv **)(charset + 0x90) = paVar2;
            if (*(long *)(charset + 0x90) == 0) {
              local_4 = L'\xffffffe2';
            }
            else {
              local_4 = L'\0';
            }
          }
        }
        else {
          iVar1 = strcmp(in_RSI,"zip64");
          if (iVar1 == 0) {
            if ((in_RDX == (archive_conflict *)0x0) || ((char)in_RDX->magic == '\0')) {
              *(uint *)(charset + 0xa8) = *(uint *)(charset + 0xa8) & 0xfffffffd;
              *(uint *)(charset + 0xa8) = *(uint *)(charset + 0xa8) | 1;
            }
            else {
              *(uint *)(charset + 0xa8) = *(uint *)(charset + 0xa8) | 2;
              *(uint *)(charset + 0xa8) = *(uint *)(charset + 0xa8) & 0xfffffffe;
            }
            local_4 = L'\0';
          }
          else {
            local_4 = L'\xffffffec';
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
archive_write_zip_options(struct archive_write *a, const char *key,
    const char *val)
{
	struct zip *zip = a->format_data;
	int ret = ARCHIVE_FAILED;

	if (strcmp(key, "compression") == 0) {
		/*
		 * Set compression to use on all future entries.
		 * This only affects regular files.
		 */
		if (val == NULL || val[0] == 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "%s: compression option needs a compression name",
			    a->format_name);
		} else if (strcmp(val, "deflate") == 0) {
#ifdef HAVE_ZLIB_H
			zip->requested_compression = COMPRESSION_DEFLATE;
			ret = ARCHIVE_OK;
#else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "deflate compression not supported");
#endif
		} else if (strcmp(val, "store") == 0) {
			zip->requested_compression = COMPRESSION_STORE;
			ret = ARCHIVE_OK;
		}
		return (ret);
	} else if (strcmp(key, "experimental") == 0) {
		if (val == NULL || val[0] == 0) {
			zip->flags &= ~ ZIP_FLAG_EXPERIMENT_EL;
		} else {
			zip->flags |= ZIP_FLAG_EXPERIMENT_EL;
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "fakecrc32") == 0) {
		/*
		 * FOR TESTING ONLY:  disable CRC calculation to speed up
		 * certain complex tests.
		 */
		if (val == NULL || val[0] == 0) {
			zip->crc32func = real_crc32;
		} else {
			zip->crc32func = fake_crc32;
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "hdrcharset")  == 0) {
		/*
		 * Set the character set used in translating filenames.
		 */
		if (val == NULL || val[0] == 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "%s: hdrcharset option needs a character-set name",
			    a->format_name);
		} else {
			zip->opt_sconv = archive_string_conversion_to_charset(
			    &a->archive, val, 0);
			if (zip->opt_sconv != NULL)
				ret = ARCHIVE_OK;
			else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	} else if (strcmp(key, "zip64") == 0) {
		/*
		 * Bias decisions about Zip64: force them to be
		 * generated in certain cases where they are not
		 * forbidden or avoid them in certain cases where they
		 * are not strictly required.
		 */
		if (val != NULL && *val != '\0') {
			zip->flags |= ZIP_FLAG_FORCE_ZIP64;
			zip->flags &= ~ZIP_FLAG_AVOID_ZIP64;
		} else {
			zip->flags &= ~ZIP_FLAG_FORCE_ZIP64;
			zip->flags |= ZIP_FLAG_AVOID_ZIP64;
		}
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}